

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O3

int sp_ztrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,doublecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  double dVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  doublecomplex dVar7;
  doublecomplex dVar8;
  doublecomplex dVar9;
  doublecomplex dVar10;
  doublecomplex dVar11;
  doublecomplex dVar12;
  doublecomplex dVar13;
  doublecomplex dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  void *pvVar18;
  undefined4 uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  doublecomplex *pdVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  double *pdVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  void *pvVar35;
  double dVar36;
  float fVar37;
  int nsupc;
  int nsupr;
  long local_180;
  long local_178;
  void *local_170;
  long local_168;
  int incx;
  void *local_158;
  double dStack_150;
  char *local_148;
  doublecomplex *local_140;
  doublecomplex temp;
  
  incx = 1;
  *info = 0;
  if ((*uplo != 'U') && (*uplo != 'L')) {
    uVar19 = 1;
    iVar33 = -1;
LAB_00104330:
    *info = iVar33;
    temp.r = (double)CONCAT44(temp.r._4_4_,uVar19);
    input_error("sp_ztrsv",(int *)&temp);
    return 0;
  }
  uVar19 = 2;
  iVar33 = -2;
  if ((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0))
  goto LAB_00104330;
  if ((*diag != 'U') && (*diag != 'N')) {
    uVar19 = 3;
    iVar33 = -3;
    goto LAB_00104330;
  }
  iVar4 = L->nrow;
  uVar19 = 4;
  iVar33 = -4;
  if (((long)iVar4 < 0) || (iVar4 != L->ncol)) goto LAB_00104330;
  uVar19 = 5;
  iVar33 = -5;
  if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_00104330;
  local_170 = L->Store;
  local_168 = *(long *)((long)local_170 + 8);
  pvVar35 = U->Store;
  local_180 = *(long *)((long)pvVar35 + 8);
  local_148 = trans;
  local_140 = doublecomplexCalloc((long)iVar4);
  if (local_140 == (doublecomplex *)0x0) {
    sprintf((char *)&temp,"%s at line %d in file %s\n","Malloc fails for work in sp_ztrsv().",0x81,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c");
    superlu_abort_and_exit((char *)&temp);
  }
  pvVar18 = local_170;
  cVar3 = *uplo;
  local_158 = pvVar35;
  if (*local_148 == 'T') {
    if (cVar3 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      pvVar35 = (void *)(long)*(int *)((long)local_170 + 4);
      if (-1 < (long)pvVar35) {
        local_180 = local_168 + 8;
        fVar37 = 0.0;
        do {
          lVar26 = *(long *)((long)local_170 + 0x30);
          iVar33 = *(int *)(lVar26 + (long)pvVar35 * 4);
          local_178 = (long)iVar33;
          iVar4 = *(int *)(*(long *)((long)local_170 + 0x20) + local_178 * 4);
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + local_178 * 4) - iVar4;
          nsupc = *(int *)(lVar26 + 4 + (long)pvVar35 * 4) - iVar33;
          lVar21 = *(long *)((long)local_170 + 0x10);
          iVar30 = *(int *)(lVar21 + local_178 * 4);
          iVar28 = *(int *)(lVar26 + 4 + (long)pvVar35 * 4);
          if (iVar33 < iVar28) {
            lVar26 = local_178;
            iVar33 = iVar30;
            do {
              iVar23 = iVar33 + nsupc;
              iVar33 = *(int *)(lVar21 + 4 + lVar26 * 4);
              if (iVar23 < iVar33) {
                dVar36 = x[lVar26].r;
                dVar15 = x[lVar26].i;
                lVar32 = (long)iVar23;
                lVar29 = *(long *)((long)local_170 + 0x18);
                lVar20 = lVar32 * 0x10 + local_180;
                lVar27 = 0;
                do {
                  dVar16 = x[*(int *)(lVar29 + (long)(iVar4 + nsupc) * 4 + lVar27)].r;
                  dVar17 = x[*(int *)(lVar29 + (long)(iVar4 + nsupc) * 4 + lVar27)].i;
                  dVar2 = *(double *)(lVar20 + -8 + lVar27 * 4);
                  dVar1 = *(double *)(lVar20 + lVar27 * 4);
                  dVar36 = dVar36 - (dVar2 * dVar16 + -dVar17 * dVar1);
                  dVar15 = dVar15 - (dVar2 * dVar17 + dVar16 * dVar1);
                  dVar13.i._0_4_ = SUB84(dVar15,0);
                  dVar13.r = dVar36;
                  dVar13.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                  x[lVar26] = dVar13;
                  lVar32 = lVar32 + 1;
                  lVar27 = lVar27 + 4;
                } while (lVar32 < iVar33);
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 != iVar28);
          }
          fVar37 = fVar37 + (float)((nsupr - nsupc) * nsupc * 8);
          local_158 = pvVar35;
          if (1 < nsupc) {
            fVar37 = fVar37 + (float)((nsupc + -1) * nsupc * 4);
            ztrsv_("L","T","U",&nsupc,(doublecomplex *)((long)iVar30 * 0x10 + local_168),&nsupr,
                   x + local_178,&incx);
          }
          pvVar35 = (void *)((long)local_158 + -1);
        } while (0 < (long)local_158);
        goto LAB_00104d11;
      }
    }
    else {
      if (U->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_170 + 4)) {
        local_180 = local_180 + 8;
        fVar37 = 0.0;
        lVar26 = 0;
        do {
          lVar21 = *(long *)((long)local_170 + 0x30);
          iVar33 = *(int *)(lVar21 + lVar26 * 4);
          lVar29 = (long)iVar33;
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar29 * 4) -
                  *(int *)(*(long *)((long)local_170 + 0x20) + lVar29 * 4);
          iVar30 = *(int *)(lVar21 + 4 + lVar26 * 4) - iVar33;
          lVar20 = (long)*(int *)(*(long *)((long)local_170 + 0x10) + lVar29 * 4);
          iVar4 = *(int *)(lVar21 + 4 + lVar26 * 4);
          if (iVar33 < iVar4) {
            lVar21 = *(long *)((long)local_158 + 0x18);
            lVar27 = lVar29;
            iVar33 = *(int *)(lVar21 + lVar29 * 4);
            do {
              iVar28 = *(int *)(lVar21 + 4 + lVar27 * 4);
              if (iVar28 - iVar33 != 0 && iVar33 <= iVar28) {
                lVar32 = *(long *)((long)local_158 + 0x10);
                dVar36 = x[lVar27].r;
                dVar15 = x[lVar27].i;
                lVar34 = (long)iVar33;
                pdVar31 = (double *)(lVar34 * 0x10 + local_180);
                do {
                  dVar2 = x[*(int *)(lVar32 + lVar34 * 4)].r;
                  dVar1 = x[*(int *)(lVar32 + lVar34 * 4)].i;
                  dVar36 = dVar36 - (pdVar31[-1] * dVar2 + -dVar1 * *pdVar31);
                  dVar15 = dVar15 - (pdVar31[-1] * dVar1 + dVar2 * *pdVar31);
                  dVar14.i._0_4_ = SUB84(dVar15,0);
                  dVar14.r = dVar36;
                  dVar14.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                  x[lVar27] = dVar14;
                  lVar34 = lVar34 + 1;
                  pdVar31 = pdVar31 + 2;
                } while (iVar28 != lVar34);
              }
              lVar27 = lVar27 + 1;
              fVar37 = fVar37 + (float)((iVar28 - iVar33) * 8);
              iVar33 = iVar28;
            } while (lVar27 != iVar4);
          }
          nsupc = iVar30;
          local_178 = lVar26;
          if (iVar30 == 1) {
            z_div(x + lVar29,x + lVar29,(doublecomplex *)(lVar20 * 0x10 + local_168));
          }
          else {
            ztrsv_("U","T","N",&nsupc,(doublecomplex *)(lVar20 * 0x10 + local_168),&nsupr,x + lVar29
                   ,&incx);
          }
          lVar26 = local_178 + 1;
          fVar37 = fVar37 + (float)((iVar30 * 4 + 0xe) * iVar30);
        } while (local_178 < *(int *)((long)local_170 + 4));
        goto LAB_00104d11;
      }
    }
  }
  else if (*local_148 == 'N') {
    if (cVar3 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_170 + 4)) {
        local_178 = local_168 + 0x18;
        pvVar35 = (void *)0x0;
        dVar36 = 0.0;
        fVar37 = 0.0;
        lVar26 = 0;
        do {
          lVar21 = *(long *)((long)local_170 + 0x20);
          iVar33 = *(int *)(*(long *)((long)local_170 + 0x30) + lVar26 * 4);
          lVar29 = (long)iVar33;
          uVar5 = *(uint *)(lVar21 + lVar29 * 4);
          nsupr = *(int *)(lVar21 + 4 + lVar29 * 4) - uVar5;
          iVar33 = *(int *)(*(long *)((long)local_170 + 0x30) + 4 + lVar26 * 4) - iVar33;
          iVar4 = *(int *)(*(long *)((long)local_170 + 0x10) + lVar29 * 4);
          uVar22 = nsupr - iVar33;
          nsupc = iVar33;
          if (iVar33 == 1) {
            iVar30 = *(int *)(lVar21 + 4 + lVar29 * 4);
            if ((int)((long)(int)uVar5 + 1) < iVar30) {
              lVar21 = *(long *)((long)local_170 + 0x18);
              pdVar31 = (double *)((long)iVar4 * 0x10 + local_178);
              lVar20 = 0;
              do {
                iVar4 = *(int *)(((long)(int)uVar5 + 1) * 4 + lVar21 + lVar20 * 4);
                dVar36 = x[lVar29].r;
                dVar15 = x[lVar29].i;
                pvVar35 = (void *)(pdVar31[-1] * dVar36 + -dVar15 * *pdVar31);
                dVar36 = pdVar31[-1] * dVar15 + dVar36 * *pdVar31;
                dVar15 = x[iVar4].i - dVar36;
                dVar7.i._0_4_ = SUB84(dVar15,0);
                dVar7.r = x[iVar4].r - (double)pvVar35;
                dVar7.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                x[iVar4] = dVar7;
                pdVar31 = pdVar31 + 2;
                lVar20 = lVar20 + 1;
              } while (~uVar5 + iVar30 != (int)lVar20);
            }
          }
          else {
            local_180 = lVar26;
            local_158 = pvVar35;
            dStack_150 = dVar36;
            zlsolve(nsupr,iVar33,(doublecomplex *)((long)iVar4 * 0x10 + local_168),x + lVar29);
            pdVar25 = local_140;
            zmatvec(nsupr,nsupr - nsupc,nsupc,
                    (doublecomplex *)((long)(nsupc + iVar4) * 0x10 + local_168),x + lVar29,local_140
                   );
            lVar26 = local_180;
            pvVar35 = local_158;
            dVar36 = dStack_150;
            if (0 < (int)uVar22) {
              lVar21 = *(long *)((long)local_170 + 0x18);
              uVar24 = 0;
              do {
                iVar4 = *(int *)((long)(int)(uVar5 + nsupc) * 4 + lVar21 + uVar24 * 4);
                dVar15 = x[iVar4].i - pdVar25->i;
                dVar8.i._0_4_ = SUB84(dVar15,0);
                dVar8.r = x[iVar4].r - pdVar25->r;
                dVar8.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                x[iVar4] = dVar8;
                pdVar25->r = (double)local_158;
                pdVar25->i = dStack_150;
                uVar24 = uVar24 + 1;
                pdVar25 = pdVar25 + 1;
              } while (uVar24 < uVar22);
            }
          }
          fVar37 = fVar37 + (float)((iVar33 * 4 + 6) * iVar33) + (float)(int)(uVar22 * iVar33 * 8);
          bVar6 = lVar26 < *(int *)((long)local_170 + 4);
          lVar26 = lVar26 + 1;
        } while (bVar6);
        goto LAB_00104d11;
      }
    }
    else {
      if (U->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_170 + 4)) {
        local_180 = local_180 + 8;
        fVar37 = 0.0;
        lVar26 = (long)*(int *)((long)local_170 + 4);
        do {
          iVar33 = *(int *)(*(long *)((long)pvVar18 + 0x30) + lVar26 * 4);
          lVar29 = (long)iVar33;
          nsupr = *(int *)(*(long *)((long)pvVar18 + 0x20) + 4 + lVar29 * 4) -
                  *(int *)(*(long *)((long)pvVar18 + 0x20) + lVar29 * 4);
          nsupc = *(int *)(*(long *)((long)pvVar18 + 0x30) + 4 + lVar26 * 4) - iVar33;
          lVar21 = (long)*(int *)(*(long *)((long)pvVar18 + 0x10) + lVar29 * 4);
          fVar37 = (float)((nsupc * 4 + 0xe) * nsupc) + fVar37;
          if (nsupc == 1) {
            pdVar25 = x + lVar29;
            z_div(pdVar25,pdVar25,(doublecomplex *)(lVar21 * 0x10 + local_168));
            iVar33 = *(int *)(*(long *)((long)pvVar35 + 0x18) + lVar29 * 4);
            lVar21 = (long)iVar33;
            iVar4 = *(int *)(*(long *)((long)pvVar35 + 0x18) + 4 + lVar29 * 4);
            if (iVar33 < iVar4) {
              lVar29 = *(long *)((long)pvVar35 + 0x10);
              pdVar31 = (double *)(lVar21 * 0x10 + local_180);
              do {
                iVar33 = *(int *)(lVar29 + lVar21 * 4);
                dVar36 = x[iVar33].i - (pdVar31[-1] * pdVar25->i + pdVar25->r * *pdVar31);
                dVar9.i._0_4_ = SUB84(dVar36,0);
                dVar9.r = x[iVar33].r - (pdVar31[-1] * pdVar25->r + -pdVar25->i * *pdVar31);
                dVar9.i._4_4_ = (int)((ulong)dVar36 >> 0x20);
                x[iVar33] = dVar9;
                lVar21 = lVar21 + 1;
                pdVar31 = pdVar31 + 2;
                pvVar35 = local_158;
              } while (iVar4 != lVar21);
            }
          }
          else {
            zusolve(nsupr,nsupc,(doublecomplex *)(lVar21 * 0x10 + local_168),x + lVar29);
            iVar4 = *(int *)(*(long *)((long)pvVar18 + 0x30) + 4 + lVar26 * 4);
            if (iVar33 < iVar4) {
              lVar21 = *(long *)((long)pvVar35 + 0x18);
              iVar33 = *(int *)(lVar21 + lVar29 * 4);
              do {
                iVar30 = *(int *)(lVar21 + 4 + lVar29 * 4);
                if (iVar30 - iVar33 != 0 && iVar33 <= iVar30) {
                  lVar20 = *(long *)((long)pvVar35 + 0x10);
                  lVar27 = (long)iVar33;
                  pdVar31 = (double *)(lVar27 * 0x10 + local_180);
                  do {
                    iVar28 = *(int *)(lVar20 + lVar27 * 4);
                    dVar15 = x[lVar29].r;
                    dVar2 = x[lVar29].i;
                    dVar36 = x[iVar28].i - (pdVar31[-1] * dVar2 + dVar15 * *pdVar31);
                    dVar10.i._0_4_ = SUB84(dVar36,0);
                    dVar10.r = x[iVar28].r - (pdVar31[-1] * dVar15 + -dVar2 * *pdVar31);
                    dVar10.i._4_4_ = (int)((ulong)dVar36 >> 0x20);
                    x[iVar28] = dVar10;
                    lVar27 = lVar27 + 1;
                    pdVar31 = pdVar31 + 2;
                  } while (iVar30 != lVar27);
                }
                lVar29 = lVar29 + 1;
                fVar37 = fVar37 + (float)((iVar30 - iVar33) * 8);
                iVar33 = iVar30;
              } while (lVar29 != iVar4);
            }
          }
          bVar6 = 0 < lVar26;
          lVar26 = lVar26 + -1;
        } while (bVar6);
        goto LAB_00104d11;
      }
    }
  }
  else if (cVar3 == 'L') {
    if (L->nrow == 0) {
      return 0;
    }
    pvVar35 = (void *)(long)*(int *)((long)local_170 + 4);
    if (-1 < (long)pvVar35) {
      local_180 = local_168 + 8;
      fVar37 = 0.0;
      do {
        lVar26 = *(long *)((long)local_170 + 0x30);
        iVar33 = *(int *)(lVar26 + (long)pvVar35 * 4);
        local_178 = (long)iVar33;
        iVar4 = *(int *)(*(long *)((long)local_170 + 0x20) + local_178 * 4);
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + local_178 * 4) - iVar4;
        nsupc = *(int *)(lVar26 + 4 + (long)pvVar35 * 4) - iVar33;
        lVar21 = *(long *)((long)local_170 + 0x10);
        iVar30 = *(int *)(lVar21 + local_178 * 4);
        iVar28 = *(int *)(lVar26 + 4 + (long)pvVar35 * 4);
        if (iVar33 < iVar28) {
          lVar26 = local_178;
          iVar33 = iVar30;
          do {
            iVar23 = iVar33 + nsupc;
            iVar33 = *(int *)(lVar21 + 4 + lVar26 * 4);
            if (iVar23 < iVar33) {
              dVar36 = x[lVar26].r;
              dVar15 = x[lVar26].i;
              lVar20 = (long)iVar23;
              lVar29 = *(long *)((long)local_170 + 0x18);
              lVar27 = lVar20 * 0x10 + local_180;
              lVar32 = 0;
              do {
                temp.r = *(double *)(lVar27 + -8 + lVar32 * 4);
                dVar2 = *(double *)(lVar27 + lVar32 * 4);
                temp.i = -dVar2;
                dVar1 = x[*(int *)(lVar29 + (long)(iVar4 + nsupc) * 4 + lVar32)].r;
                dVar16 = x[*(int *)(lVar29 + (long)(iVar4 + nsupc) * 4 + lVar32)].i;
                dVar36 = dVar36 - (temp.r * dVar1 + dVar16 * dVar2);
                dVar15 = dVar15 - (temp.r * dVar16 + dVar1 * temp.i);
                dVar11.i._0_4_ = SUB84(dVar15,0);
                dVar11.r = dVar36;
                dVar11.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                x[lVar26] = dVar11;
                lVar20 = lVar20 + 1;
                lVar32 = lVar32 + 4;
              } while (lVar20 < iVar33);
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != iVar28);
        }
        fVar37 = fVar37 + (float)((nsupr - nsupc) * nsupc * 8);
        local_158 = pvVar35;
        if (1 < nsupc) {
          fVar37 = fVar37 + (float)((nsupc + -1) * nsupc * 4);
          ztrsv_("L",local_148,"U",&nsupc,(doublecomplex *)((long)iVar30 * 0x10 + local_168),&nsupr,
                 x + local_178,&incx);
        }
        pvVar35 = (void *)((long)local_158 + -1);
      } while (0 < (long)local_158);
      goto LAB_00104d11;
    }
  }
  else {
    if (U->nrow == 0) {
      return 0;
    }
    if (-1 < *(int *)((long)local_170 + 4)) {
      local_180 = local_180 + 8;
      fVar37 = 0.0;
      lVar26 = 0;
      do {
        lVar21 = *(long *)((long)local_170 + 0x30);
        iVar33 = *(int *)(lVar21 + lVar26 * 4);
        lVar29 = (long)iVar33;
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar29 * 4) -
                *(int *)(*(long *)((long)local_170 + 0x20) + lVar29 * 4);
        iVar28 = *(int *)(lVar21 + 4 + lVar26 * 4) - iVar33;
        iVar4 = *(int *)(*(long *)((long)local_170 + 0x10) + lVar29 * 4);
        iVar30 = *(int *)(lVar21 + 4 + lVar26 * 4);
        if (iVar33 < iVar30) {
          lVar21 = *(long *)((long)local_158 + 0x18);
          lVar20 = lVar29;
          iVar33 = *(int *)(lVar21 + lVar29 * 4);
          do {
            iVar23 = *(int *)(lVar21 + 4 + lVar20 * 4);
            if (iVar23 - iVar33 != 0 && iVar33 <= iVar23) {
              lVar27 = *(long *)((long)local_158 + 0x10);
              dVar36 = x[lVar20].r;
              dVar15 = x[lVar20].i;
              lVar32 = (long)iVar33;
              pdVar31 = (double *)(lVar32 * 0x10 + local_180);
              do {
                temp.r = pdVar31[-1];
                temp.i = -*pdVar31;
                dVar2 = x[*(int *)(lVar27 + lVar32 * 4)].r;
                dVar1 = x[*(int *)(lVar27 + lVar32 * 4)].i;
                dVar36 = dVar36 - (temp.r * dVar2 + dVar1 * *pdVar31);
                dVar15 = dVar15 - (temp.r * dVar1 + dVar2 * temp.i);
                dVar12.i._0_4_ = SUB84(dVar15,0);
                dVar12.r = dVar36;
                dVar12.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
                x[lVar20] = dVar12;
                lVar32 = lVar32 + 1;
                pdVar31 = pdVar31 + 2;
              } while (iVar23 != lVar32);
            }
            lVar20 = lVar20 + 1;
            fVar37 = fVar37 + (float)((iVar23 - iVar33) * 8);
            iVar33 = iVar23;
          } while (lVar20 != iVar30);
        }
        pdVar25 = (doublecomplex *)((long)iVar4 * 0x10 + local_168);
        nsupc = iVar28;
        local_178 = lVar26;
        if (iVar28 == 1) {
          temp.r = pdVar25->r;
          temp.i = -pdVar25->i;
          z_div(x + lVar29,x + lVar29,&temp);
        }
        else {
          ztrsv_("U",local_148,"N",&nsupc,pdVar25,&nsupr,x + lVar29,&incx);
        }
        lVar26 = local_178 + 1;
        fVar37 = fVar37 + (float)((iVar28 * 4 + 0xe) * iVar28);
      } while (local_178 < *(int *)((long)local_170 + 4));
      goto LAB_00104d11;
    }
  }
  fVar37 = 0.0;
LAB_00104d11:
  stat->ops[0x11] = fVar37 + stat->ops[0x11];
  superlu_free(local_140);
  return 0;
}

Assistant:

int
sp_ztrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, doublecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    doublecomplex temp;
    doublecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    doublecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ztrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doublecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ztrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 z_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ztrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    zgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    zlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    zmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			z_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 z_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[fsupc], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ztrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    zusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			zz_mult(&comp_zero, &x[jcol], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			zz_mult(&comp_zero, &x[irow], &Lval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ztrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[irow], &Uval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ztrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        zz_conj(&temp, &Lval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    ZTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ztrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        zz_conj(&temp, &Uval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    zz_conj(&temp, &Lval[luptr]);
		    z_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    ZTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ztrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}